

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

int divsufsort(uchar *T,int *SA,int n,int openMP)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  int *bucket_A;
  int *bucket_B;
  uint *puVar5;
  uint uVar6;
  uint *puVar7;
  uint uVar8;
  ulong uVar9;
  char *__assertion;
  int in_R9D;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  
  if (n < 0 || (SA == (int *)0x0 || T == (uchar *)0x0)) {
    n = -1;
  }
  else if (n != 0) {
    if (n == 2) {
      bVar2 = *T;
      bVar1 = T[1];
      SA[bVar2 >= bVar1] = 0;
      SA[bVar2 < bVar1] = 1;
    }
    else {
      if (n != 1) {
        bucket_A = (int *)malloc(0x400);
        bucket_B = (int *)malloc(0x40000);
        if (bucket_B == (int *)0x0 || bucket_A == (int *)0x0) {
          iVar3 = -2;
        }
        else {
          iVar3 = sort_typeBstar(T,SA,bucket_A,bucket_B,n,in_R9D);
          if (0 < iVar3) {
            for (uVar4 = 0xfe; -1 < (int)uVar4; uVar4 = uVar4 - 1) {
              uVar6 = uVar4 << 8;
              iVar3 = bucket_B[(int)(uVar4 + 1 | uVar6)];
              puVar7 = (uint *)(SA + bucket_A[(ulong)uVar4 + 1]);
              puVar5 = (uint *)0x0;
              uVar9 = 0xffffffffffffffff;
              while (puVar7 = puVar7 + -1, SA + iVar3 <= puVar7) {
                uVar10 = *puVar7;
                uVar12 = (ulong)uVar10;
                if ((int)uVar10 < 1) {
                  if ((uVar12 == 0) && (uVar4 != *T)) {
                    __assert_fail("((s == 0) && (T[s] == c1)) || (s < 0)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0xbb27,
                                  "void construct_SA(const unsigned char *, int *, int *, int *, int, int)"
                                 );
                  }
                  *puVar7 = ~uVar10;
                }
                else {
                  bVar2 = T[uVar12];
                  if (uVar4 != bVar2) {
                    __assert_fail("T[s] == c1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0xbb1a,
                                  "void construct_SA(const unsigned char *, int *, int *, int *, int, int)"
                                 );
                  }
                  if ((n <= (int)(uVar12 + 1)) || (T[uVar12 + 1] < bVar2)) {
                    __assert_fail("((s + 1) < n) && (T[s] <= T[s + 1])",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0xbb1b,
                                  "void construct_SA(const unsigned char *, int *, int *, int *, int, int)"
                                 );
                  }
                  if (bVar2 < T[uVar12 - 1]) {
                    __assert_fail("T[s - 1] <= T[s]",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0xbb1c,
                                  "void construct_SA(const unsigned char *, int *, int *, int *, int, int)"
                                 );
                  }
                  *puVar7 = ~uVar10;
                  bVar2 = T[uVar10 - 1];
                  uVar8 = 0;
                  if ((uVar12 != 1) && (uVar8 = uVar10 - 1, bVar2 < T[uVar12 - 2])) {
                    uVar8 = -uVar10;
                  }
                  uVar10 = (uint)uVar9;
                  if (uVar10 == bVar2) {
                    uVar9 = uVar9 & 0xffffffff;
                  }
                  else {
                    if (-1 < (int)uVar10) {
                      bucket_B[(int)(uVar10 | uVar6)] = (int)((ulong)((long)puVar5 - (long)SA) >> 2)
                      ;
                    }
                    puVar5 = (uint *)(SA + bucket_B[(long)(int)uVar6 | (ulong)bVar2]);
                    uVar9 = (ulong)bVar2;
                  }
                  if (puVar7 <= puVar5) {
                    __assertion = "k < j";
LAB_001791de:
                    __assert_fail(__assertion,
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0xbb24,
                                  "void construct_SA(const unsigned char *, int *, int *, int *, int, int)"
                                 );
                  }
                  if (puVar5 == (uint *)0x0) {
                    __assertion = "k != NULL";
                    goto LAB_001791de;
                  }
                  *puVar5 = uVar8;
                  puVar5 = puVar5 + -1;
                }
              }
            }
          }
          uVar9 = (ulong)T[n - 1U];
          uVar4 = -n;
          if (T[n - 1U] <= T[(ulong)(uint)n - 2]) {
            uVar4 = n - 1U;
          }
          puVar7 = (uint *)(SA + bucket_A[uVar9] + 1);
          SA[bucket_A[uVar9]] = uVar4;
          for (puVar5 = (uint *)SA; puVar5 < SA + (uint)n; puVar5 = puVar5 + 1) {
            uVar4 = *puVar5;
            lVar11 = (long)(int)uVar4;
            if (lVar11 < 1) {
              if (-1 < (int)uVar4) {
                __assert_fail("s < 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xbb3f,
                              "void construct_SA(const unsigned char *, int *, int *, int *, int, int)"
                             );
              }
              *puVar5 = ~uVar4;
            }
            else {
              if (T[lVar11 + -1] < T[lVar11]) {
                __assert_fail("T[s - 1] >= T[s]",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xbb35,
                              "void construct_SA(const unsigned char *, int *, int *, int *, int, int)"
                             );
              }
              uVar6 = uVar4 - 1;
              bVar2 = T[uVar6];
              if ((uVar6 == 0) || (T[lVar11 + -2] < bVar2)) {
                uVar6 = -uVar4;
              }
              if ((uint)uVar9 != (uint)bVar2) {
                bucket_A[uVar9] = (int)((ulong)((long)puVar7 - (long)SA) >> 2);
                puVar7 = (uint *)(SA + bucket_A[(uint)bVar2]);
                uVar9 = (ulong)bVar2;
              }
              if (puVar7 <= puVar5) {
                __assert_fail("i < k",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xbb3c,
                              "void construct_SA(const unsigned char *, int *, int *, int *, int, int)"
                             );
              }
              *puVar7 = uVar6;
              puVar7 = puVar7 + 1;
            }
          }
          iVar3 = 0;
        }
        free(bucket_B);
        free(bucket_A);
        return iVar3;
      }
      *SA = 0;
    }
    n = 0;
  }
  return n;
}

Assistant:

int
divsufsort(const unsigned char *T, int *SA, int n, int openMP) {
  int *bucket_A, *bucket_B;
  int m;
  int err = 0;

  /* Check arguments. */
  if((T == NULL) || (SA == NULL) || (n < 0)) { return -1; }
  else if(n == 0) { return 0; }
  else if(n == 1) { SA[0] = 0; return 0; }
  else if(n == 2) { m = (T[0] < T[1]); SA[m ^ 1] = 0, SA[m] = 1; return 0; }

  bucket_A = (int *)malloc(BUCKET_A_SIZE * sizeof(int));
  bucket_B = (int *)malloc(BUCKET_B_SIZE * sizeof(int));

  /* Suffixsort. */
  if((bucket_A != NULL) && (bucket_B != NULL)) {
    m = sort_typeBstar(T, SA, bucket_A, bucket_B, n, openMP);
    construct_SA(T, SA, bucket_A, bucket_B, n, m);
  } else {
    err = -2;
  }

  free(bucket_B);
  free(bucket_A);

  return err;
}